

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

void __thiscall testing::internal::CapturedStream::~CapturedStream(CapturedStream *this)

{
  remove((this->filename_)._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

~CapturedStream() {
    remove(filename_.c_str());
  }